

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::PreferredSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  int in_ESI;
  long *in_RDI;
  int order;
  int connect;
  
  iVar1 = pztopology::TPZLine::SideDimension(0x19f70a0);
  iVar2 = (**(code **)(*in_RDI + 0xb0))();
  if (iVar1 < iVar2 + -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZCompElHDiv<pzshape::TPZShapeLinear>::PreferredSideOrder(int) [TSHAPE = pzshape::TPZShapeLinear]"
                            );
    poVar3 = std::operator<<(poVar3," side ");
    this_00 = (void *)std::ostream::operator<<(poVar3,in_ESI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,in_ESI);
  if ((-1 < iVar1) && (iVar2 = (**(code **)(*in_RDI + 0x90))(), iVar1 <= iVar2)) {
    iVar2 = (**(code **)(*in_RDI + 0x90))();
    if (iVar1 < iVar2) {
      return (int)in_RDI[5];
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::operator<<(poVar3,"\n");
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::PreferredSideOrder(int side) {
	if(TSHAPE::SideDimension(side) < Dimension()-1)
	{
		PZError << __PRETTY_FUNCTION__ << " side " << side << std::endl;
	}
	int connect= SideConnectLocId(0,side);
	if(connect<0 || connect > NConnects()) {
		PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate " <<  endl;
		return -1;
	}
	if(connect<NConnects()) {
			int order =this->fPreferredOrder;
			return order;//this->AdjustPreferredSideOrder(side,order);
	}
	PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = " << connect << "\n";
	return 0;

}